

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_fsp.cpp
# Opt level: O3

void * __thiscall ON_FixedSizePool::Element(ON_FixedSizePool *this,size_t element_index)

{
  ulong uVar1;
  ulong uVar2;
  long *plVar3;
  
  if ((element_index < this->m_total_element_count) &&
     (plVar3 = (long *)this->m_first_block, plVar3 != (long *)0x0)) {
    uVar1 = this->m_sizeof_element;
    do {
      if (plVar3 == (long *)this->m_al_block) {
        if ((ulong)((long)this->m_al_element_array + (-0x10 - (long)plVar3)) / uVar1 <=
            element_index) {
          return (void *)0x0;
        }
LAB_0048c241:
        return (void *)((long)plVar3 + uVar1 * element_index + 0x10);
      }
      uVar2 = ((plVar3[1] - (long)plVar3) - 0x10U) / uVar1;
      if (element_index < uVar2) goto LAB_0048c241;
      plVar3 = (long *)*plVar3;
      element_index = element_index - uVar2;
    } while (plVar3 != (long *)0x0);
  }
  return (void *)0x0;
}

Assistant:

void* ON_FixedSizePool::Element(size_t element_index) const
{
  if (element_index < (size_t)m_total_element_count)
  {
    const char* block;
    const char* block_end;
    const char* next_block;
    size_t block_count;

    for (block = (const char*)m_first_block; 0 != block; block = next_block)
    {
      if (block == m_al_block)
      {
        next_block = nullptr;

        // for debugging
        // block += sizeof(void*);
        // block_end = *((const char**)(block));
        // block += sizeof(void*);

        block_end = (const char*)m_al_element_array;
        block += 2*sizeof(void*);
      }
      else
      {
        next_block = *((const char**)block);
        block += sizeof(void*);
        block_end = *((const char**)(block));
        block += sizeof(void*);
      }
      block_count = (block_end - block) / m_sizeof_element;
      if (element_index < block_count)
        return ((void*)(block + element_index*m_sizeof_element));
      element_index -= block_count;
    }
  }

  return nullptr;
}